

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase725::run(TestCase725 *this)

{
  uint uVar1;
  undefined4 uVar2;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  char *pcVar3;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  int in_R8D;
  bool bVar4;
  bool destroyed;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_3f8;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  request;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request_1;
  uint oldSentCount;
  Client capCopy;
  Client client;
  ArrayPtr<const_char> local_310;
  Promise<void> destructionPromise;
  PromiseFulfillerPair<void> paf;
  Maybe<capnp::MessageSize> local_2d0;
  Maybe<capnp::MessageSize> local_2b8;
  Maybe<capnp::MessageSize> local_2a0;
  Maybe<capnp::MessageSize> local_288;
  Maybe<capnp::MessageSize> local_270;
  Maybe<capnp::MessageSize> local_258;
  Maybe<capnp::MessageSize> local_240;
  Maybe<capnp::MessageSize> local_228;
  Maybe<capnp::MessageSize> local_210;
  Maybe<capnp::MessageSize> local_1f8;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  Maybe<capnp::MessageSize> local_1b0;
  Maybe<capnp::MessageSize> local_198;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> local_180 [3];
  Own<capnp::ResponseHook> local_150;
  TestContext context;
  
  TestContext::TestContext(&context);
  kj::newPromiseAndFulfiller<void>();
  destroyed = false;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&paf,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:730:46),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065d170;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&destroyed;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase725::run()::$_0,kj::_::PropagateException>>
        ::instance;
  request_1.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase725::run()::$_0,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_3f8.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase725::run()::$_0,kj::_::PropagateException>>
        ::instance;
  request_1.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_3f8.super_Builder._builder.capTable = (CapTableBuilder *)this_00;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request_1);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Promise<void>::eagerlyEvaluate(&destructionPromise,&local_3f8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_3f8);
  TestContext::connect((TestContext *)&request,(int)&context,(sockaddr *)0x5,(socklen_t)in_RCX);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>(&client,(Client *)&request)
  ;
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&request);
  local_198.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest(&request,&client,&local_198);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>
            ((kj *)&local_3f8,&paf.fulfiller);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestCapDestructor,void>
            ((Client *)&request_1,(Own<capnp::_::TestCapDestructor> *)&local_3f8);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Builder::setCap
            (&request.super_Builder,(Client *)&request_1);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&request_1.super_Builder._builder.capTable);
  kj::Own<capnp::_::TestCapDestructor>::dispose((Own<capnp::_::TestCapDestructor> *)&local_3f8);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)&request_1,(int)&request,__buf,in_RCX,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            (local_180,&request_1);
  kj::Own<capnp::ResponseHook>::dispose(&local_150);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)&request_1);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  local_1b0.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_1b0);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&request_1,(int)&local_3f8,__buf_00,in_RCX,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
  bVar4 = true;
  if (0x1f < request.super_Builder._builder.dataSize) {
    bVar4 = *request.super_Builder._builder.data != 1;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &request_1);
  kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  pcVar3 = (char *)CONCAT71((int7)(in_RCX >> 8),kj::_::Debug::minSeverity < 3);
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    capCopy._vptr_Client._0_4_ = 1;
    local_1c8.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_1c8
              );
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)&request_1,(int)&local_3f8,__buf_01,(size_t)pcVar3,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
    local_310.ptr._0_4_ = 0;
    if (0x1f < request.super_Builder._builder.dataSize) {
      local_310.ptr._0_4_ = *request.super_Builder._builder.data;
    }
    pcVar3 = 
    "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4f83bb;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2e7,ERROR,
               "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&capCopy,(uint *)&local_310);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
    ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                    *)&request_1);
    kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  }
  if ((destroyed == true) && (kj::_::Debug::minSeverity < 3)) {
    pcVar3 = "\"failed: expected \" \"!(destroyed)\"";
    in_R8D = 0x4c8afa;
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ea,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
              *)&local_3f8,&client,&local_1e0);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)&request_1,(int)&local_3f8,__buf_02,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)&request,&request_1);
  capCopy._0_16_ =
       capnproto_test::capnp::test::TestMoreStuff::CallHeldResults::Reader::getS((Reader *)&request)
  ;
  bVar4 = kj::operator==("bar",(StringPtr *)&capCopy);
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)
             &request_1);
  kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  if (!bVar4 && kj::_::Debug::minSeverity < 3) {
    local_1f8.ptr.isSet = false;
    capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
              ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
                *)&local_3f8,&client,&local_1f8);
    Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
    ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
            *)&request_1,(int)&local_3f8,__buf_03,(size_t)pcVar3,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
                *)&request,&request_1);
    capCopy._0_16_ =
         capnproto_test::capnp::test::TestMoreStuff::CallHeldResults::Reader::getS
                   ((Reader *)&request);
    pcVar3 = 
    "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
    ;
    in_R8D = 0x4f84c6;
    kj::_::Debug::log<char_const(&)[93],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ed,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
               ,(char (*) [93])
                "failed: expected (\"bar\") == (client.callHeldRequest().send().wait(context.waitScope).getS())"
               ,(char (*) [4])0x501447,(Reader *)&capCopy);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)
               &request_1);
    kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  }
  local_210.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
              *)&local_3f8,&client,&local_210);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
          *)&request_1,(int)&local_3f8,__buf_04,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>
              *)&request,&request_1);
  capnproto_test::capnp::test::TestMoreStuff::GetHeldResults::Reader::getCap
            (&capCopy,(Reader *)&request);
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults> *)&request_1
            );
  kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  oldSentCount = (context.clientNetwork)->sent;
  local_228.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&request_1,&capCopy,&local_228);
  *(undefined4 *)request_1.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request_1.super_Builder._builder.data + 4) =
       *(byte *)((long)request_1.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&local_3f8,(int)&request_1,__buf_05,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &request,&local_3f8);
  local_310 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)&request);
  bVar4 = kj::operator==("foo",(StringPtr *)&local_310);
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_3f8);
  if (!bVar4 && 2 >= kj::_::Debug::minSeverity) {
    Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
    ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
            *)&local_3f8,(int)&request_1,__buf_06,
           CONCAT71((int7)((ulong)pcVar3 >> 8),2 < kj::_::Debug::minSeverity),in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
               &request,&local_3f8);
    local_310 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                          ((Reader *)&request);
    in_R8D = 0x4f85ac;
    kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2f9,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (request.send().wait(context.waitScope).getX())\", \"foo\", request.send().wait(context.waitScope).getX()"
               ,(char (*) [76])
                "failed: expected (\"foo\") == (request.send().wait(context.waitScope).getX())",
               (char (*) [4])0x4f93d8,(Reader *)&local_310);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_3f8);
  }
  uVar1 = (context.clientNetwork)->sent;
  pcVar3 = (char *)(ulong)uVar1;
  if ((oldSentCount != uVar1) && (kj::_::Debug::minSeverity < 3)) {
    request.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(request.super_Builder._builder.segment._4_4_,uVar1);
    pcVar3 = 
    "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
    ;
    in_R8D = 0x4f867b;
    kj::_::Debug::log<char_const(&)[74],unsigned_int&,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2fa,ERROR,
               "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
               ,(char (*) [74])
                "failed: expected (oldSentCount) == (context.clientNetwork.getSentCount())",
               &oldSentCount,(uint *)&request);
  }
  kj::Own<capnp::RequestHook>::dispose(&request_1.hook);
  local_240.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callFooRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
              *)&request_1,&client,&local_240);
  capnproto_test::capnp::test::TestMoreStuff::CallFooParams::Builder::setCap
            ((Builder *)&request_1,&capCopy);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
          *)&local_3f8,(int)&request_1,__buf_07,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
              *)&request,&local_3f8);
  local_310 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestMoreStuff::CallFooResults::Reader::getS
                        ((Reader *)&request);
  bVar4 = kj::operator==("bar",(StringPtr *)&local_310);
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> *)&local_3f8
            );
  if (!bVar4 && kj::_::Debug::minSeverity < 3) {
    Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
    ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
            *)&local_3f8,(int)&request_1,__buf_08,(size_t)pcVar3,in_R8D);
    kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
              ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
                *)&request,&local_3f8);
    local_310 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestMoreStuff::CallFooResults::Reader::getS
                          ((Reader *)&request);
    pcVar3 = 
    "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
    ;
    in_R8D = 0x4f874e;
    kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x301,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
               ,(char (*) [76])
                "failed: expected (\"bar\") == (request.send().wait(context.waitScope).getS())",
               (char (*) [4])0x501447,(Reader *)&local_310);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>::~RemotePromise
              ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> *)
               &local_3f8);
  }
  kj::Own<capnp::RequestHook>::dispose(&request_1.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&capCopy.field_0x8);
  local_258.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_258);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&request_1,(int)&local_3f8,__buf_09,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
  bVar4 = true;
  if (0x1f < request.super_Builder._builder.dataSize) {
    bVar4 = *request.super_Builder._builder.data != 5;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &request_1);
  kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    capCopy._vptr_Client._0_4_ = 5;
    local_270.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_270
              );
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)&request_1,(int)&local_3f8,__buf_10,(size_t)pcVar3,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
    uVar2 = 0;
    if (0x1f < request.super_Builder._builder.dataSize) {
      uVar2 = *request.super_Builder._builder.data;
    }
    local_310.ptr._0_4_ = uVar2;
    pcVar3 = 
    "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4f8849;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x306,ERROR,
               "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&capCopy,(uint *)&local_310);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
    ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                    *)&request_1);
    kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  }
  local_288.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_288);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&request_1,(int)&local_3f8,__buf_11,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
  bVar4 = true;
  if (0x1f < request.super_Builder._builder.dataSize) {
    bVar4 = *request.super_Builder._builder.data != 6;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &request_1);
  kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    capCopy._vptr_Client._0_4_ = 6;
    local_2a0.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_2a0
              );
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)&request_1,(int)&local_3f8,__buf_12,(size_t)pcVar3,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
    uVar2 = 0;
    if (0x1f < request.super_Builder._builder.dataSize) {
      uVar2 = *request.super_Builder._builder.data;
    }
    local_310.ptr._0_4_ = uVar2;
    pcVar3 = 
    "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
    ;
    in_R8D = 0x4f8958;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x307,ERROR,
               "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&capCopy,(uint *)&local_310);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
    ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                    *)&request_1);
    kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  }
  local_2b8.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_2b8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&request_1,(int)&local_3f8,__buf_13,(size_t)pcVar3,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
  bVar4 = true;
  if (0x1f < request.super_Builder._builder.dataSize) {
    bVar4 = *request.super_Builder._builder.data != 7;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &request_1);
  kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  __n = CONCAT71((int7)((ulong)pcVar3 >> 8),kj::_::Debug::minSeverity < 3);
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    capCopy._vptr_Client._0_4_ = 7;
    local_2d0.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_3f8,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),&local_2d0
              );
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)&request_1,(int)&local_3f8,__buf_14,__n,in_R8D);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&request,&request_1);
    uVar2 = 0;
    if (0x1f < request.super_Builder._builder.dataSize) {
      uVar2 = *request.super_Builder._builder.data;
    }
    local_310.ptr._0_4_ = uVar2;
    kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x308,ERROR,
               "\"failed: expected \" \"(7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 7, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
               ,(char (*) [96])
                "failed: expected (7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
               ,(int *)&capCopy,(uint *)&local_310);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)&request.hook.ptr);
    RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
    ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                    *)&request_1);
    kj::Own<capnp::RequestHook>::dispose(&local_3f8.hook);
  }
  if ((destroyed == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x30b,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::Promise<void>::wait(&destructionPromise,&context.waitScope);
  if ((destroyed == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x311,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&destructionPromise);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
  TestContext::~TestContext(&context);
  return;
}

Assistant:

TEST(Rpc, RetainAndRelease) {
  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  {
    auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
        .castAs<test::TestMoreStuff>();

    {
      auto request = client.holdRequest();
      request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
      request.send().wait(context.waitScope);
    }

    // Do some other call to add a round trip.
    EXPECT_EQ(1, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Shouldn't be destroyed because it's being held by the server.
    EXPECT_FALSE(destroyed);

    // We can ask it to call the held capability.
    EXPECT_EQ("bar", client.callHeldRequest().send().wait(context.waitScope).getS());

    {
      // We can get the cap back from it.
      auto capCopy = client.getHeldRequest().send().wait(context.waitScope).getCap();

      {
        // And call it, without any network communications.
        uint oldSentCount = context.clientNetwork.getSentCount();
        auto request = capCopy.fooRequest();
        request.setI(123);
        request.setJ(true);
        EXPECT_EQ("foo", request.send().wait(context.waitScope).getX());
        EXPECT_EQ(oldSentCount, context.clientNetwork.getSentCount());
      }

      {
        // We can send another copy of the same cap to another method, and it works.
        auto request = client.callFooRequest();
        request.setCap(capCopy);
        EXPECT_EQ("bar", request.send().wait(context.waitScope).getS());
      }
    }

    // Give some time to settle.
    EXPECT_EQ(5, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(6, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(7, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Can't be destroyed, we haven't released it.
    EXPECT_FALSE(destroyed);
  }

  // We released our client, which should cause the server to be released, which in turn will
  // release the cap pointing back to us.
  destructionPromise.wait(context.waitScope);
  EXPECT_TRUE(destroyed);
}